

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O2

int __thiscall
rw::Clump::clone(Clump *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  LLLink *pLVar1;
  int iVar2;
  Clump *clump;
  Frame *pFVar3;
  undefined4 extraout_var;
  LLLink *pLVar4;
  void *extraout_RDX;
  void *__child_stack_00;
  void *extraout_RDX_00;
  LLLink *pLVar5;
  Atomic *this_00;
  
  pLVar4 = (LLLink *)(ulong)(uint)__flags;
  clump = create();
  pFVar3 = Frame::cloneAndLink((Frame *)(this->object).parent);
  (clump->object).parent = pFVar3;
  __child_stack_00 = extraout_RDX;
  pLVar5 = (this->atomics).link.next;
  while (pLVar5 != &(this->atomics).link) {
    pLVar1 = pLVar5->next;
    iVar2 = Atomic::clone((Atomic *)&pLVar5[-6].prev,__fn,__child_stack_00,(int)pLVar4,__arg);
    this_00 = (Atomic *)CONCAT44(extraout_var,iVar2);
    __fn = (__fn *)pLVar5[-5].next[0xc].next;
    Atomic::setFrame(this_00,(Frame *)__fn);
    this_00->clump = clump;
    (this_00->inClump).next = &(clump->atomics).link;
    pLVar4 = (clump->atomics).link.prev;
    (this_00->inClump).prev = pLVar4;
    pLVar4->next = &this_00->inClump;
    (clump->atomics).link.prev = &this_00->inClump;
    __child_stack_00 = extraout_RDX_00;
    pLVar5 = pLVar1;
  }
  Frame::purgeClone((Frame *)(this->object).parent);
  if (this->world != (World *)0x0) {
    World::addClump(this->world,clump);
  }
  PluginList::copy((PluginList *)&s_plglist,(EVP_PKEY_CTX *)clump,(EVP_PKEY_CTX *)this);
  return (int)clump;
}

Assistant:

Clump*
Clump::clone(void)
{
	Clump *clump = Clump::create();
	Frame *root = this->getFrame()->cloneAndLink();
	clump->setFrame(root);
	FORLIST(lnk, this->atomics){
		Atomic *a = Atomic::fromClump(lnk);
		Atomic *atomic = a->clone();
		atomic->setFrame(a->getFrame()->root);
		clump->addAtomic(atomic);
	}
	this->getFrame()->purgeClone();

	// World extension
	if(this->world)
		this->world->addClump(clump);

	s_plglist.copy(clump, this);
	return clump;
}